

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char.cpp
# Opt level: O2

string * normalize_char_name(string *__return_storage_ptr__,string *s)

{
  ulong uVar1;
  pointer pcVar2;
  int iVar3;
  size_type sVar4;
  ulong uVar5;
  string *__range2;
  allocator local_29;
  
  uVar1 = s->_M_string_length;
  if (uVar1 < 2) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)s);
  }
  else {
    pcVar2 = (s->_M_dataplus)._M_p;
    for (uVar5 = 0; uVar1 != uVar5; uVar5 = uVar5 + 1) {
      iVar3 = tolower((int)pcVar2[uVar5]);
      pcVar2[uVar5] = (char)iVar3;
    }
    sVar4 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>_>_>
            ::count(&charnames_abi_cxx11_,s);
    if (sVar4 == 0) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_29);
    }
    else {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)s);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string normalize_char_name(std::string s)
{
    if(s.length() > 1)
    {
        for(char &c : s)
            c = tolower(c);
        return charnames.count(s) ? s : "";
    }
    return s;
}